

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSHelper.h
# Opt level: O3

void __thiscall Assimp::D3DS::Material::Material(Material *this,string *name)

{
  pointer pcVar1;
  
  this->_vptr_Material = (_func_int **)&PTR__Material_0080e7c8;
  (this->mName)._M_dataplus._M_p = (pointer)&(this->mName).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mName,pcVar1,pcVar1 + name->_M_string_length);
  (this->mDiffuse).r = 0.6;
  (this->mDiffuse).g = 0.6;
  *(undefined8 *)&(this->mDiffuse).b = 0x3f19999a;
  this->mShininessStrength = 1.0;
  (this->mSpecular).r = 0.0;
  (this->mSpecular).g = 0.0;
  *(undefined8 *)&(this->mSpecular).b = 0;
  (this->mAmbient).g = 0.0;
  (this->mAmbient).b = 0.0;
  this->mShading = Gouraud;
  this->mTransparency = 1.0;
  (this->sTexDiffuse).mMapName._M_dataplus._M_p = (pointer)&(this->sTexDiffuse).mMapName.field_2;
  (this->sTexDiffuse).mMapName._M_string_length = 0;
  (this->sTexDiffuse).mMapName.field_2._M_local_buf[0] = '\0';
  (this->sTexDiffuse).mOffsetU = 0.0;
  (this->sTexDiffuse).mOffsetV = 0.0;
  (this->sTexDiffuse).mScaleU = 1.0;
  (this->sTexDiffuse).mScaleV = 1.0;
  (this->sTexDiffuse).iUVSrc = 0;
  (this->sTexDiffuse).mRotation = 0.0;
  (this->sTexDiffuse).mMapMode = aiTextureMapMode_Wrap;
  (this->sTexDiffuse).bPrivate = false;
  (this->sTexDiffuse).mTextureBlend = NAN;
  (this->sTexOpacity).mMapName._M_dataplus._M_p = (pointer)&(this->sTexOpacity).mMapName.field_2;
  (this->sTexOpacity).mMapName._M_string_length = 0;
  (this->sTexOpacity).mMapName.field_2._M_local_buf[0] = '\0';
  (this->sTexOpacity).mOffsetU = 0.0;
  (this->sTexOpacity).mOffsetV = 0.0;
  (this->sTexOpacity).mScaleU = 1.0;
  (this->sTexOpacity).mScaleV = 1.0;
  (this->sTexOpacity).iUVSrc = 0;
  (this->sTexOpacity).mRotation = 0.0;
  (this->sTexOpacity).mMapMode = aiTextureMapMode_Wrap;
  (this->sTexOpacity).bPrivate = false;
  (this->sTexOpacity).mTextureBlend = NAN;
  (this->sTexSpecular).mMapName._M_dataplus._M_p = (pointer)&(this->sTexSpecular).mMapName.field_2;
  (this->sTexSpecular).mMapName._M_string_length = 0;
  (this->sTexSpecular).mMapName.field_2._M_local_buf[0] = '\0';
  (this->sTexSpecular).mOffsetU = 0.0;
  (this->sTexSpecular).mOffsetV = 0.0;
  (this->sTexSpecular).mScaleU = 1.0;
  (this->sTexSpecular).mScaleV = 1.0;
  *(undefined8 *)&(this->sTexSpecular).iUVSrc = 0x7fc0000000000000;
  (this->sTexSpecular).mRotation = 0.0;
  (this->sTexSpecular).mMapMode = aiTextureMapMode_Wrap;
  (this->sTexSpecular).bPrivate = false;
  (this->sTexSpecular).mTextureBlend = NAN;
  (this->sTexReflective).mMapName._M_dataplus._M_p =
       (pointer)&(this->sTexReflective).mMapName.field_2;
  (this->sTexReflective).mMapName._M_string_length = 0;
  (this->sTexReflective).mMapName.field_2._M_local_buf[0] = '\0';
  (this->sTexReflective).mOffsetU = 0.0;
  (this->sTexReflective).mOffsetV = 0.0;
  (this->sTexReflective).mScaleU = 1.0;
  (this->sTexReflective).mScaleV = 1.0;
  (this->sTexReflective).iUVSrc = 0;
  (this->sTexReflective).mRotation = 0.0;
  (this->sTexReflective).mMapMode = aiTextureMapMode_Wrap;
  (this->sTexReflective).bPrivate = false;
  (this->sTexBump).mMapName._M_dataplus._M_p = (pointer)&(this->sTexBump).mMapName.field_2;
  (this->sTexBump).mMapName._M_string_length = 0;
  (this->sTexBump).mMapName.field_2._M_local_buf[0] = '\0';
  (this->sTexBump).mOffsetU = 0.0;
  (this->sTexBump).mOffsetV = 0.0;
  (this->sTexBump).mScaleU = 1.0;
  (this->sTexBump).mScaleV = 1.0;
  (this->sTexBump).iUVSrc = 0;
  (this->sTexBump).bPrivate = false;
  (this->sTexBump).mRotation = 0.0;
  (this->sTexBump).mMapMode = aiTextureMapMode_Wrap;
  (this->sTexBump).mTextureBlend = NAN;
  (this->sTexEmissive).mMapName._M_dataplus._M_p = (pointer)&(this->sTexEmissive).mMapName.field_2;
  (this->sTexEmissive).mMapName._M_string_length = 0;
  (this->sTexEmissive).mMapName.field_2._M_local_buf[0] = '\0';
  (this->sTexEmissive).mOffsetU = 0.0;
  (this->sTexEmissive).mOffsetV = 0.0;
  (this->sTexEmissive).mScaleU = 1.0;
  (this->sTexEmissive).mScaleV = 1.0;
  (this->sTexEmissive).iUVSrc = 0;
  (this->sTexEmissive).bPrivate = false;
  (this->sTexEmissive).mRotation = 0.0;
  (this->sTexEmissive).mMapMode = aiTextureMapMode_Wrap;
  (this->sTexEmissive).mTextureBlend = NAN;
  (this->sTexShininess).mMapName._M_dataplus._M_p = (pointer)&(this->sTexShininess).mMapName.field_2
  ;
  (this->sTexShininess).mMapName._M_string_length = 0;
  (this->sTexShininess).mMapName.field_2._M_local_buf[0] = '\0';
  (this->sTexShininess).mOffsetU = 0.0;
  (this->sTexShininess).mOffsetV = 0.0;
  (this->sTexShininess).mScaleU = 1.0;
  (this->sTexShininess).mScaleV = 1.0;
  (this->sTexShininess).iUVSrc = 0;
  (this->sTexShininess).bPrivate = false;
  (this->sTexShininess).mRotation = 0.0;
  (this->sTexShininess).mMapMode = aiTextureMapMode_Wrap;
  (this->sTexShininess).mTextureBlend = NAN;
  this->mBumpHeight = 1.0;
  (this->mEmissive).r = 0.0;
  (this->mEmissive).g = 0.0;
  (this->mEmissive).b = 0.0;
  (this->sTexAmbient).mMapName._M_dataplus._M_p = (pointer)&(this->sTexAmbient).mMapName.field_2;
  (this->sTexAmbient).mMapName._M_string_length = 0;
  (this->sTexAmbient).mMapName.field_2._M_local_buf[0] = '\0';
  (this->sTexAmbient).mOffsetU = 0.0;
  (this->sTexAmbient).mOffsetV = 0.0;
  (this->sTexAmbient).mScaleU = 1.0;
  (this->sTexAmbient).mScaleV = 1.0;
  (this->sTexAmbient).iUVSrc = 0;
  (this->sTexAmbient).bPrivate = false;
  (this->sTexAmbient).mRotation = 0.0;
  (this->sTexAmbient).mMapMode = aiTextureMapMode_Wrap;
  (this->sTexAmbient).mTextureBlend = NAN;
  this->mTwoSided = false;
  return;
}

Assistant:

explicit Material(const std::string &name)
    : mName(name)
    , mDiffuse            ( ai_real( 0.6 ), ai_real( 0.6 ), ai_real( 0.6 ) ) // FIX ... we won't want object to be black
    , mSpecularExponent   ( ai_real( 0.0 ) )
    , mShininessStrength  ( ai_real( 1.0 ) )
    , mShading(Discreet3DS::Gouraud)
    , mTransparency       ( ai_real( 1.0 ) )
    , mBumpHeight         ( ai_real( 1.0 ) )
    , mTwoSided           (false)
    {
    }